

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle_decoder.cpp
# Opt level: O2

void __thiscall
duckdb::RLEDecoder::Read
          (RLEDecoder *this,uint8_t *defines,idx_t read_count,Vector *result,idx_t result_offset)

{
  ResizeableBuffer *this_00;
  idx_t iVar1;
  idx_t new_size;
  pointer this_01;
  
  new_size = ColumnReader::GetValidCount(this->reader,defines,read_count,result_offset);
  this_00 = this->decoded_data_buffer;
  iVar1 = this_00->alloc_len;
  (this_00->super_ByteBuffer).ptr = (this_00->allocated_data).pointer;
  (this_00->super_ByteBuffer).len = iVar1;
  ResizeableBuffer::resize(this_00,this->reader->reader->allocator,new_size);
  this_01 = unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>,_true>::
            operator->(&this->rle_decoder);
  RleBpDecoder::GetBatch<unsigned_char>
            (this_01,(this->decoded_data_buffer->super_ByteBuffer).ptr,(uint32_t)new_size);
  ColumnReader::PlainTemplated<bool,duckdb::TemplatedParquetValueConversion<bool>>
            (this->reader,&this->decoded_data_buffer->super_ByteBuffer,defines,read_count,
             result_offset,result);
  return;
}

Assistant:

void RLEDecoder::Read(uint8_t *defines, idx_t read_count, Vector &result, idx_t result_offset) {
	// RLE encoding for boolean
	D_ASSERT(reader.Type().id() == LogicalTypeId::BOOLEAN);
	idx_t valid_count = reader.GetValidCount(defines, read_count, result_offset);
	decoded_data_buffer.reset();
	decoded_data_buffer.resize(reader.reader.allocator, sizeof(bool) * valid_count);
	rle_decoder->GetBatch<uint8_t>(decoded_data_buffer.ptr, valid_count);
	reader.PlainTemplated<bool, TemplatedParquetValueConversion<bool>>(decoded_data_buffer, defines, read_count,
	                                                                   result_offset, result);
}